

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O2

repcodes_t duckdb_zstd::ZSTD_newRep(U32 *rep,U32 offBase,U32 ll0)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  U32 *pUVar4;
  U32 UVar5;
  repcodes_t rVar6;
  repcodes_t newReps;
  
  newReps.rep[2] = rep[2];
  uVar1 = *(undefined8 *)rep;
  newReps.rep[0] = (U32)uVar1;
  newReps.rep[1] = SUB84(uVar1,4);
  uVar2 = newReps.rep._0_8_;
  newReps.rep[0] = (U32)uVar1;
  if (offBase < 4) {
    uVar3 = (offBase + ll0) - 1;
    if (uVar3 == 3) {
      UVar5 = newReps.rep[0] - 1;
    }
    else {
      if (uVar3 == 0) goto LAB_01f82c26;
      UVar5 = newReps.rep[uVar3];
    }
    pUVar4 = newReps.rep + 1;
    if (uVar3 == 1) {
      pUVar4 = newReps.rep + 2;
    }
    newReps.rep[2] = *pUVar4;
  }
  else {
    newReps.rep[1] = SUB84(uVar1,4);
    UVar5 = offBase - 3;
    newReps.rep[2] = newReps.rep[1];
  }
  newReps.rep[1] = newReps.rep[0];
  newReps.rep[0] = UVar5;
  uVar2 = newReps.rep._0_8_;
LAB_01f82c26:
  newReps.rep._0_8_ = uVar2;
  rVar6.rep[2] = newReps.rep[2];
  rVar6.rep[0] = newReps.rep[0];
  rVar6.rep[1] = newReps.rep[1];
  return (repcodes_t)rVar6.rep;
}

Assistant:

MEM_STATIC repcodes_t
ZSTD_newRep(U32 const rep[ZSTD_REP_NUM], U32 const offBase, U32 const ll0)
{
    repcodes_t newReps;
    ZSTD_memcpy(&newReps, rep, sizeof(newReps));
    ZSTD_updateRep(newReps.rep, offBase, ll0);
    return newReps;
}